

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBToRAWRow_SSSE3(uint8_t *src,uint8_t *dst,int width)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  uvec8 auVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar7 = libyuv::kShuffleMaskARGBToRAW;
  do {
    auVar4 = *(undefined1 (*) [16])src;
    pauVar1 = (undefined1 (*) [16])((long)src + 0x10);
    pauVar2 = (undefined1 (*) [16])((long)src + 0x20);
    pauVar3 = (undefined1 (*) [16])((long)src + 0x30);
    src = (uint8_t *)((long)src + 0x40);
    auVar9 = pshufb(auVar4,(undefined1  [16])auVar7);
    auVar10 = pshufb(*pauVar1,(undefined1  [16])auVar7);
    auVar11 = pshufb(*pauVar2,(undefined1  [16])auVar7);
    auVar12 = pshufb(*pauVar3,(undefined1  [16])auVar7);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar10._0_8_ << 0x20;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = auVar11._0_8_;
    *(undefined1 (*) [16])dst = auVar9 | auVar4 << 0x40;
    auVar9._0_8_ = auVar12._0_8_ << 0x20;
    auVar9._8_8_ = auVar12._8_8_ << 0x20 | auVar12._0_8_ >> 0x20;
    *(undefined1 (*) [16])((long)dst + 0x10) = auVar10 >> 0x20 | auVar6 << 0x40;
    *(undefined1 (*) [16])((long)dst + 0x20) = auVar11 >> 0x40 | auVar9;
    dst = (uint8_t *)((long)dst + 0x30);
    iVar8 = width + -0x10;
    bVar5 = 0xf < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar5);
  return;
}

Assistant:

void ARGBToRAWRow_SSSE3(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(

      "movdqa      %3,%%xmm6                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x30(%0),%%xmm3               \n"
      "lea         0x40(%0),%0                   \n"
      "pshufb      %%xmm6,%%xmm0                 \n"
      "pshufb      %%xmm6,%%xmm1                 \n"
      "pshufb      %%xmm6,%%xmm2                 \n"
      "pshufb      %%xmm6,%%xmm3                 \n"
      "movdqa      %%xmm1,%%xmm4                 \n"
      "psrldq      $0x4,%%xmm1                   \n"
      "pslldq      $0xc,%%xmm4                   \n"
      "movdqa      %%xmm2,%%xmm5                 \n"
      "por         %%xmm4,%%xmm0                 \n"
      "pslldq      $0x8,%%xmm5                   \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "por         %%xmm5,%%xmm1                 \n"
      "psrldq      $0x8,%%xmm2                   \n"
      "pslldq      $0x4,%%xmm3                   \n"
      "por         %%xmm3,%%xmm2                 \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "movdqu      %%xmm2,0x20(%1)               \n"
      "lea         0x30(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src),                  // %0
        "+r"(dst),                  // %1
        "+r"(width)                 // %2
      : "m"(kShuffleMaskARGBToRAW)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}